

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.c
# Opt level: O2

uint8_t * quicly_encode_close_frame
                    (uint8_t *base,uint64_t error_code,uint64_t offending_frame_type,
                    char *reason_phrase)

{
  size_t v;
  uint8_t *puVar1;
  long lVar2;
  long lStack_30;
  
  v = strlen(reason_phrase);
  if (base == (uint8_t *)0x0) {
    if (error_code < 0x40) {
      lStack_30 = 2;
      lVar2 = lStack_30;
    }
    else if (error_code < 0x4000) {
      lStack_30 = 3;
      lVar2 = lStack_30;
    }
    else {
      lVar2 = (ulong)(0x3fffffff < error_code) * 4 + 5;
    }
    if (offending_frame_type != 0xffffffffffffffff) {
      if (offending_frame_type < 0x40) {
        lStack_30 = 1;
      }
      else if (offending_frame_type < 0x4000) {
        lStack_30 = 2;
      }
      else {
        lStack_30 = (ulong)(0x3fffffff < offending_frame_type) * 4 + 4;
      }
      lVar2 = lVar2 + lStack_30;
    }
    if (v < 0x40) {
      lStack_30 = 1;
    }
    else if (v < 0x4000) {
      lStack_30 = 2;
    }
    else {
      lStack_30 = (ulong)(0x3fffffff < v) * 4 + 4;
    }
    lStack_30 = lStack_30 + lVar2;
  }
  else {
    puVar1 = ptls_encode_quicint(base,(ulong)(offending_frame_type == 0xffffffffffffffff) | 0x1c);
    puVar1 = ptls_encode_quicint(puVar1,error_code);
    lVar2 = (long)puVar1 - (long)base;
    if (offending_frame_type != 0xffffffffffffffff) {
      puVar1 = ptls_encode_quicint(base + lVar2,offending_frame_type);
      lVar2 = (long)puVar1 - (long)base;
    }
    puVar1 = ptls_encode_quicint(base + lVar2,v);
    lStack_30 = (long)puVar1 - (long)base;
    memcpy(puVar1,reason_phrase,v);
  }
  return base + lStack_30 + v;
}

Assistant:

uint8_t *quicly_encode_close_frame(uint8_t *const base, uint64_t error_code, uint64_t offending_frame_type,
                                   const char *reason_phrase)
{
    size_t offset = 0, reason_phrase_len = strlen(reason_phrase);

#define PUSHV(v)                                                                                                                   \
    do {                                                                                                                           \
        if (base != NULL) {                                                                                                        \
            offset = quicly_encodev(base + offset, (v)) - base;                                                                    \
        } else {                                                                                                                   \
            offset += quicly_encodev_capacity(v);                                                                                  \
        }                                                                                                                          \
    } while (0)

    PUSHV(offending_frame_type == UINT64_MAX ? QUICLY_FRAME_TYPE_APPLICATION_CLOSE : QUICLY_FRAME_TYPE_TRANSPORT_CLOSE);
    PUSHV(error_code);
    if (offending_frame_type != UINT64_MAX)
        PUSHV(offending_frame_type);
    PUSHV(reason_phrase_len);
    if (base != NULL)
        memcpy(base + offset, reason_phrase, reason_phrase_len);
    offset += reason_phrase_len;

#undef PUSHV

    return base + offset;
}